

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_flow_scalar(yaml_parser_t *parser,int single)

{
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  yaml_token_t **tail;
  yaml_char_t *pyVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  byte bVar16;
  size_t sVar17;
  size_t sVar18;
  yaml_token_t *pyVar19;
  byte *pbVar20;
  yaml_token_t *pyVar21;
  size_t sVar22;
  long lVar23;
  char cVar24;
  char cVar25;
  ulong length;
  byte **b_end;
  byte bVar26;
  yaml_mark_t start_mark;
  yaml_token_t token;
  byte *local_138;
  byte *pbStack_130;
  byte *local_128 [2];
  byte *local_118;
  byte *pbStack_110;
  yaml_char_t *local_108 [2];
  byte *local_f8;
  byte *pbStack_f0;
  byte *local_e8 [2];
  byte *local_d8;
  byte *pbStack_d0;
  byte *local_c8;
  yaml_mark_t *local_c0;
  yaml_mark_t *local_b8;
  yaml_mark_t *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  size_t local_98;
  uint local_8c;
  yaml_token_t local_88;
  
  bVar26 = 0;
  iVar9 = yaml_parser_save_simple_key(parser);
  if (iVar9 != 0) {
    parser->simple_key_allowed = 0;
    local_128[0] = (byte *)0x0;
    local_138 = (byte *)0x0;
    pbStack_130 = (byte *)0x0;
    local_e8[0] = (byte *)0x0;
    local_f8 = (byte *)0x0;
    pbStack_f0 = (byte *)0x0;
    local_108[0] = (byte *)0x0;
    local_118 = (byte *)0x0;
    pbStack_110 = (byte *)0x0;
    local_c8 = (byte *)0x0;
    local_d8 = (byte *)0x0;
    pbStack_d0 = (byte *)0x0;
    local_138 = (byte *)yaml_malloc(0x10);
    if (local_138 != (byte *)0x0) {
      pbStack_130 = local_138 + 0x10;
      local_138[0] = 0;
      local_138[1] = 0;
      local_138[2] = 0;
      local_138[3] = 0;
      local_138[4] = 0;
      local_138[5] = 0;
      local_138[6] = 0;
      local_138[7] = 0;
      local_138[8] = 0;
      local_138[9] = 0;
      local_138[10] = 0;
      local_138[0xb] = 0;
      local_138[0xc] = 0;
      local_138[0xd] = 0;
      local_138[0xe] = 0;
      local_138[0xf] = 0;
      local_128[0] = local_138;
      local_f8 = (byte *)yaml_malloc(0x10);
      if (local_f8 != (byte *)0x0) {
        pbStack_f0 = local_f8 + 0x10;
        local_f8[0] = 0;
        local_f8[1] = 0;
        local_f8[2] = 0;
        local_f8[3] = 0;
        local_f8[4] = 0;
        local_f8[5] = 0;
        local_f8[6] = 0;
        local_f8[7] = 0;
        local_f8[8] = 0;
        local_f8[9] = 0;
        local_f8[10] = 0;
        local_f8[0xb] = 0;
        local_f8[0xc] = 0;
        local_f8[0xd] = 0;
        local_f8[0xe] = 0;
        local_f8[0xf] = 0;
        local_e8[0] = local_f8;
        local_118 = (byte *)yaml_malloc(0x10);
        if (local_118 != (byte *)0x0) {
          pbStack_110 = local_118 + 0x10;
          local_118[0] = 0;
          local_118[1] = 0;
          local_118[2] = 0;
          local_118[3] = 0;
          local_118[4] = 0;
          local_118[5] = 0;
          local_118[6] = 0;
          local_118[7] = 0;
          local_118[8] = 0;
          local_118[9] = 0;
          local_118[10] = 0;
          local_118[0xb] = 0;
          local_118[0xc] = 0;
          local_118[0xd] = 0;
          local_118[0xe] = 0;
          local_118[0xf] = 0;
          local_108[0] = local_118;
          local_d8 = (byte *)yaml_malloc(0x10);
          if (local_d8 != (byte *)0x0) {
            local_c8 = local_d8;
            pbStack_d0 = local_d8 + 0x10;
            local_d8[0] = 0;
            local_d8[1] = 0;
            local_d8[2] = 0;
            local_d8[3] = 0;
            local_d8[4] = 0;
            local_d8[5] = 0;
            local_d8[6] = 0;
            local_d8[7] = 0;
            local_d8[8] = 0;
            local_d8[9] = 0;
            local_d8[10] = 0;
            local_d8[0xb] = 0;
            local_d8[0xc] = 0;
            local_d8[0xd] = 0;
            local_d8[0xe] = 0;
            local_d8[0xf] = 0;
            local_98 = (parser->mark).column;
            local_a8 = (undefined4)(parser->mark).index;
            uStack_a4 = *(undefined4 *)((long)&(parser->mark).index + 4);
            uStack_a0 = (undefined4)(parser->mark).line;
            uStack_9c = *(undefined4 *)((long)&(parser->mark).line + 4);
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            pbVar20 = (parser->buffer).pointer;
            bVar12 = *pbVar20;
            lVar13 = 1;
            if ((((char)bVar12 < '\0') && (lVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
               (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)) {
              lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
            }
            local_c0 = &parser->mark;
            (parser->buffer).pointer = pbVar20 + lVar13;
            local_b8 = &parser->context_mark;
            local_b0 = &parser->problem_mark;
            local_8c = (uint)(single != 0) * 5 + 0x22;
            do {
              if ((parser->unread < 4) && (iVar9 = yaml_parser_update_buffer(parser,4), iVar9 == 0))
              goto LAB_0010de24;
              if ((parser->mark).column == 0) {
                pyVar3 = (parser->buffer).pointer;
                if (*pyVar3 != '.') {
                  if (((*pyVar3 == '-') && (pyVar3[1] == '-')) && (pyVar3[2] == '-'))
                  goto LAB_0010d484;
                  goto LAB_0010ca15;
                }
                if ((pyVar3[1] != '.') || (pyVar3[2] != '.')) goto LAB_0010ca15;
LAB_0010d484:
                bVar12 = pyVar3[3];
                if (bVar12 == 0xc2) {
                  if (pyVar3[4] != 0x85) {
LAB_0010d64c:
                    if (bVar12 != 0) goto LAB_0010ca15;
                  }
                }
                else if (bVar12 == 0xe2) {
                  if ((pyVar3[4] != 0x80) || (pyVar3[5] != 0xa8)) goto LAB_0010d64c;
                }
                else if ((0x20 < bVar12) ||
                        ((0x100002601U >> ((ulong)(uint)bVar12 & 0x3f) & 1) == 0))
                goto LAB_0010ca15;
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a quoted scalar";
                local_b8->column = local_98;
                local_b8->index = CONCAT44(uStack_a4,local_a8);
                local_b8->line = CONCAT44(uStack_9c,uStack_a0);
                pcVar15 = "found unexpected document indicator";
LAB_0010deaf:
                parser->problem = pcVar15;
                local_b0->column = local_c0->column;
                sVar17 = local_c0->line;
                local_b0->index = local_c0->index;
                local_b0->line = sVar17;
                goto LAB_0010de24;
              }
LAB_0010ca15:
              if (*(parser->buffer).pointer == '\0') {
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a quoted scalar";
                local_b8->column = local_98;
                local_b8->index = CONCAT44(uStack_a4,local_a8);
                local_b8->line = CONCAT44(uStack_9c,uStack_a0);
                pcVar15 = "found unexpected end of stream";
                goto LAB_0010deaf;
              }
LAB_0010ca25:
              if ((parser->unread < 2) && (iVar9 = yaml_parser_update_buffer(parser,2), iVar9 == 0))
              goto LAB_0010de24;
              pbVar20 = (parser->buffer).pointer;
              bVar12 = *pbVar20;
              cVar24 = '\0';
              uVar10 = (uint)bVar12;
              cVar25 = cVar24;
              if (bVar12 == 0xc2) {
                cVar25 = '\0';
                if (pbVar20[1] == 0x85) goto LAB_0010d6e2;
                if (uVar10 == 0) {
                  cVar25 = -0x3e;
                  goto LAB_0010d6e2;
                }
              }
              else if (bVar12 == 0xe2) {
                if (((pbVar20[1] == 0x80) && (pbVar20[2] == 0xa8)) || (cVar25 = '\0', uVar10 == 0))
                goto LAB_0010d6e2;
              }
              else if ((uVar10 < 0x21) && ((0x100002601U >> ((ulong)uVar10 & 0x3f) & 1) != 0))
              goto LAB_0010d6e2;
              if (single != 0) {
                bVar16 = 0x27;
                if ((bVar12 != 0x27) || (pbVar20[1] != 0x27)) goto LAB_0010cc2b;
                if ((local_128[0] + 5 < pbStack_130) ||
                   (iVar9 = yaml_string_extend(&local_138,local_128,&pbStack_130), iVar9 != 0))
                goto LAB_0010cb09;
                break;
              }
              bVar16 = 0x22;
LAB_0010cc2b:
              cVar25 = cVar24;
              if (bVar16 == bVar12) goto LAB_0010d6e2;
              if (uVar10 != 0x5c || single != 0) {
LAB_0010cd1b:
                if ((pbStack_130 <= local_128[0] + 5) &&
                   (iVar9 = yaml_string_extend(&local_138,local_128,&pbStack_130), iVar9 == 0))
                break;
                pbVar20 = (parser->buffer).pointer;
                bVar12 = *pbVar20;
                if ((char)bVar12 < '\0') {
                  if ((bVar12 & 0xe0) == 0xc0) {
LAB_0010cdc6:
                    (parser->buffer).pointer = pbVar20 + 1;
                    *local_128[0] = *pbVar20;
                    pbVar20 = (parser->buffer).pointer;
                    local_128[0] = local_128[0] + 1;
                    goto LAB_0010cdea;
                  }
                  if ((bVar12 & 0xf0) == 0xe0) {
LAB_0010cda2:
                    (parser->buffer).pointer = pbVar20 + 1;
                    *local_128[0] = *pbVar20;
                    pbVar20 = (parser->buffer).pointer;
                    local_128[0] = local_128[0] + 1;
                    goto LAB_0010cdc6;
                  }
                  if ((bVar12 & 0xf8) == 0xf0) {
                    (parser->buffer).pointer = pbVar20 + 1;
                    *local_128[0] = *pbVar20;
                    pbVar20 = (parser->buffer).pointer;
                    local_128[0] = local_128[0] + 1;
                    goto LAB_0010cda2;
                  }
                }
                else {
LAB_0010cdea:
                  (parser->buffer).pointer = pbVar20 + 1;
                  *local_128[0] = *pbVar20;
                  local_128[0] = local_128[0] + 1;
                }
                (parser->mark).index = (parser->mark).index + 1;
                psVar1 = &(parser->mark).column;
                *psVar1 = *psVar1 + 1;
                parser->unread = parser->unread - 1;
                goto LAB_0010ca25;
              }
              bVar12 = pbVar20[1];
              if (bVar12 < 0xe2) {
                if (bVar12 != 0xc2) {
                  if ((bVar12 != 10) && (bVar12 != 0xd)) goto LAB_0010cca6;
                  goto LAB_0010d4c4;
                }
                if (pbVar20[2] == 0x85) goto LAB_0010d4c4;
LAB_0010cca6:
                if (uVar10 != 0x5c || single != 0) goto LAB_0010cd1b;
                if ((pbStack_130 <= local_128[0] + 5) &&
                   (iVar9 = yaml_string_extend(&local_138,local_128,&pbStack_130), iVar9 == 0)) {
                  parser->error = YAML_MEMORY_ERROR;
LAB_0010ce5d:
                  bVar6 = true;
                  goto LAB_0010d425;
                }
                bVar12 = (parser->buffer).pointer[1];
                bVar7 = true;
                if (bVar12 < 0x5c) {
                  if (bVar12 < 0x2f) {
                    if (bVar12 == 9) goto switchD_0010cd03_caseD_74;
                    if (bVar12 == 0x20) {
                      *local_128[0] = 0x20;
                      local_128[0] = local_128[0] + 1;
                    }
                    else {
                      if (bVar12 != 0x22) goto switchD_0010cd03_caseD_5d;
                      *local_128[0] = 0x22;
                      local_128[0] = local_128[0] + 1;
                    }
                  }
                  else {
                    switch(bVar12) {
                    case 0x4c:
                      *local_128[0] = 0xe2;
                      pbVar20 = local_128[0] + 2;
                      local_128[0][1] = 0x80;
                      local_128[0] = local_128[0] + 3;
                      *pbVar20 = 0xa8;
                      break;
                    case 0x4d:
                    case 0x4f:
                    case 0x51:
                    case 0x52:
                    case 0x53:
                    case 0x54:
switchD_0010cd03_caseD_5d:
                      parser->error = YAML_SCANNER_ERROR;
                      parser->context = "while parsing a quoted scalar";
                      local_b8->column = local_98;
                      local_b8->index = CONCAT44(uStack_a4,local_a8);
                      local_b8->line = CONCAT44(uStack_9c,uStack_a0);
                      parser->problem = "found unknown escape character";
                      local_b0->column = local_c0->column;
                      uVar4 = *(undefined4 *)((long)&local_c0->index + 4);
                      sVar17 = local_c0->line;
                      uVar5 = *(undefined4 *)((long)&local_c0->line + 4);
                      *(int *)&local_b0->index = (int)local_c0->index;
                      *(undefined4 *)((long)&local_b0->index + 4) = uVar4;
                      *(int *)&local_b0->line = (int)sVar17;
                      *(undefined4 *)((long)&local_b0->line + 4) = uVar5;
                      goto LAB_0010ce5d;
                    case 0x4e:
                      pbVar20 = local_128[0] + 1;
                      *local_128[0] = 0xc2;
                      local_128[0] = local_128[0] + 2;
                      *pbVar20 = 0x85;
                      break;
                    case 0x50:
                      *local_128[0] = 0xe2;
                      pbVar20 = local_128[0] + 2;
                      local_128[0][1] = 0x80;
                      local_128[0] = local_128[0] + 3;
                      *pbVar20 = 0xa9;
                      break;
                    case 0x55:
                      length = 8;
                      goto LAB_0010d03c;
                    default:
                      if (bVar12 == 0x2f) {
                        *local_128[0] = 0x2f;
                        local_128[0] = local_128[0] + 1;
                      }
                      else {
                        if (bVar12 != 0x30) goto switchD_0010cd03_caseD_5d;
                        *local_128[0] = 0;
                        local_128[0] = local_128[0] + 1;
                      }
                    }
                  }
                  goto LAB_0010d0aa;
                }
                switch(bVar12) {
                case 0x5c:
                  *local_128[0] = 0x5c;
                  local_128[0] = local_128[0] + 1;
                  break;
                default:
                  goto switchD_0010cd03_caseD_5d;
                case 0x5f:
                  *local_128[0] = 0xc2;
                  local_128[0][1] = 0xa0;
                  local_128[0] = local_128[0] + 2;
                  break;
                case 0x61:
                  *local_128[0] = 7;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x62:
                  *local_128[0] = 8;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x65:
                  *local_128[0] = 0x1b;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x66:
                  *local_128[0] = 0xc;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x6e:
                  *local_128[0] = 10;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x72:
                  *local_128[0] = 0xd;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x74:
switchD_0010cd03_caseD_74:
                  *local_128[0] = 9;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x75:
                  length = 4;
                  goto LAB_0010d03c;
                case 0x76:
                  *local_128[0] = 0xb;
                  local_128[0] = local_128[0] + 1;
                  break;
                case 0x78:
                  length = 2;
LAB_0010d03c:
                  bVar6 = false;
                  goto LAB_0010d0b2;
                }
LAB_0010d0aa:
                bVar6 = true;
                bVar7 = false;
                length = 0;
LAB_0010d0b2:
                sVar17 = (parser->mark).index;
                (parser->mark).index = sVar17 + 1;
                sVar18 = (parser->mark).column;
                (parser->mark).column = sVar18 + 1;
                pbVar20 = (parser->buffer).pointer;
                sVar22 = parser->unread;
                parser->unread = sVar22 - 1;
                bVar12 = *pbVar20;
                lVar13 = 1;
                lVar23 = 1;
                if ((((char)bVar12 < '\0') && (lVar23 = 2, (bVar12 & 0xe0) != 0xc0)) &&
                   (lVar23 = 3, (bVar12 & 0xf0) != 0xe0)) {
                  lVar23 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                }
                (parser->buffer).pointer = pbVar20 + lVar23;
                (parser->mark).index = sVar17 + 2;
                (parser->mark).column = sVar18 + 2;
                uVar14 = sVar22 - 2;
                parser->unread = uVar14;
                bVar12 = pbVar20[lVar23];
                if ((((char)bVar12 < '\0') && (lVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
                   (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)) {
                  lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                }
                (parser->buffer).pointer = pbVar20 + lVar23 + lVar13;
                if (bVar6) {
LAB_0010d423:
                  bVar6 = false;
                }
                else {
                  if ((uVar14 < length) &&
                     (iVar9 = yaml_parser_update_buffer(parser,length), iVar9 == 0)) {
LAB_0010d2d2:
                    bVar6 = true;
                    bVar8 = false;
                  }
                  else {
                    uVar14 = 0;
                    if (bVar7) {
                      lVar13 = 0;
                      uVar14 = 0;
                      do {
                        bVar12 = (parser->buffer).pointer[lVar13];
                        if ((9 < (byte)(bVar12 - 0x30)) &&
                           ((0x25 < bVar12 - 0x41 ||
                            ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) == 0)))) {
                          pcVar15 = "did not find expected hexdecimal number";
                          goto LAB_0010d283;
                        }
                        iVar9 = -0x30;
                        if ((byte)(bVar12 + 0x9f) < 6) {
                          iVar9 = -0x57;
                        }
                        if ((byte)(bVar12 + 0xbf) < 6) {
                          iVar9 = -0x37;
                        }
                        uVar14 = (ulong)((int)uVar14 * 0x10 + (uint)bVar12 + iVar9);
                        lVar13 = lVar13 + 1;
                      } while (length + (length == 0) != lVar13);
                    }
                    uVar10 = (uint)uVar14;
                    pcVar15 = "found invalid Unicode character escape code";
                    if (0x10ffff < uVar10 || (uVar10 & 0xfffff800) == 0xd800) {
LAB_0010d283:
                      parser->error = YAML_SCANNER_ERROR;
                      parser->context = "while parsing a quoted scalar";
                      local_b8->column = local_98;
                      local_b8->index = CONCAT44(uStack_a4,local_a8);
                      local_b8->line = CONCAT44(uStack_9c,uStack_a0);
                      parser->problem = pcVar15;
                      local_b0->column = local_c0->column;
                      uVar4 = *(undefined4 *)((long)&local_c0->index + 4);
                      sVar17 = local_c0->line;
                      uVar5 = *(undefined4 *)((long)&local_c0->line + 4);
                      *(int *)&local_b0->index = (int)local_c0->index;
                      *(undefined4 *)((long)&local_b0->index + 4) = uVar4;
                      *(int *)&local_b0->line = (int)sVar17;
                      *(undefined4 *)((long)&local_b0->line + 4) = uVar5;
                      goto LAB_0010d2d2;
                    }
                    if (0x7f < uVar10) {
                      if (uVar10 < 0x800) {
                        bVar12 = (byte)(uVar14 >> 6) | 0xc0;
                      }
                      else {
                        pbVar20 = local_128[0] + 1;
                        if (uVar10 < 0x10000) {
                          *local_128[0] = (byte)(uVar10 >> 0xc) | 0xe0;
                          local_128[0] = pbVar20;
                        }
                        else {
                          *local_128[0] = (byte)(uVar10 >> 0x12) | 0xf0;
                          local_128[0] = local_128[0] + 2;
                          *pbVar20 = (byte)(uVar14 >> 0xc) & 0x3f | 0x80;
                        }
                        bVar12 = (byte)(uVar14 >> 6) & 0x3f | 0x80;
                      }
                      *local_128[0] = bVar12;
                      uVar10 = uVar10 & 0xffffff3f | 0x80;
                      local_128[0] = local_128[0] + 1;
                    }
                    pbVar20 = local_128[0] + 1;
                    *local_128[0] = (byte)uVar10;
                    bVar6 = false;
                    bVar8 = true;
                    local_128[0] = pbVar20;
                    if (bVar7) {
                      sVar17 = (parser->mark).index;
                      sVar18 = (parser->mark).column;
                      pbVar20 = (parser->buffer).pointer;
                      lVar13 = length + (length == 0);
                      sVar22 = parser->unread;
                      do {
                        sVar18 = sVar18 + 1;
                        sVar22 = sVar22 - 1;
                        sVar17 = sVar17 + 1;
                        (parser->mark).index = sVar17;
                        (parser->mark).column = sVar18;
                        parser->unread = sVar22;
                        bVar12 = *pbVar20;
                        lVar23 = 1;
                        if ((((char)bVar12 < '\0') && (lVar23 = 2, (bVar12 & 0xe0) != 0xc0)) &&
                           (lVar23 = 3, (bVar12 & 0xf0) != 0xe0)) {
                          lVar23 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                        }
                        pbVar20 = pbVar20 + lVar23;
                        (parser->buffer).pointer = pbVar20;
                        lVar13 = lVar13 + -1;
                      } while (lVar13 != 0);
                    }
                  }
                  if (bVar8) goto LAB_0010d423;
                }
LAB_0010d425:
                if (bVar6) goto LAB_0010de24;
                goto LAB_0010ca25;
              }
              if (((bVar12 != 0xe2) || (pbVar20[2] != 0x80)) || (pbVar20[3] != 0xa8))
              goto LAB_0010cca6;
LAB_0010d4c4:
              if ((parser->unread < 3) && (iVar9 = yaml_parser_update_buffer(parser,3), iVar9 == 0))
              goto LAB_0010de24;
              sVar17 = (parser->mark).index;
              (parser->mark).index = sVar17 + 1;
              psVar1 = &(parser->mark).column;
              *psVar1 = *psVar1 + 1;
              pbVar20 = (parser->buffer).pointer;
              sVar18 = parser->unread;
              parser->unread = sVar18 - 1;
              bVar12 = *pbVar20;
              lVar13 = 1;
              if (((char)bVar12 < '\0') &&
                 ((lVar13 = 2, (bVar12 & 0xe0) != 0xc0 && (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)))) {
                lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
              }
              pbVar11 = pbVar20 + lVar13;
              (parser->buffer).pointer = pbVar11;
              bVar12 = pbVar20[lVar13];
              cVar25 = '\x01';
              if (bVar12 < 0xc2) {
                if (bVar12 == 10) goto LAB_0010d66f;
                if (bVar12 != 0xd) goto LAB_0010d6e2;
                if (pbVar11[1] != 10) goto LAB_0010d66f;
                (parser->mark).index = sVar17 + 3;
                (parser->mark).column = 0;
                psVar1 = &(parser->mark).line;
                *psVar1 = *psVar1 + 1;
                parser->unread = sVar18 - 3;
                lVar13 = 2;
              }
              else {
                if (((bVar12 != 0xc2) || (pbVar11[1] != 0x85)) &&
                   ((bVar12 != 0xe2 || ((pbVar11[1] != 0x80 || (pbVar11[2] != 0xa8))))))
                goto LAB_0010d6e2;
LAB_0010d66f:
                (parser->mark).index = sVar17 + 2;
                (parser->mark).column = 0;
                psVar1 = &(parser->mark).line;
                *psVar1 = *psVar1 + 1;
                parser->unread = sVar18 - 2;
                bVar12 = *pbVar11;
                lVar13 = 1;
                if ((((char)bVar12 < '\0') && (lVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
                   (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)) {
                  lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                }
              }
              (parser->buffer).pointer = pbVar11 + lVar13;
LAB_0010d6e2:
              if ((parser->unread == 0) && (iVar9 = yaml_parser_update_buffer(parser,1), iVar9 == 0)
                 ) goto LAB_0010de24;
              pbVar20 = (parser->buffer).pointer;
              if (local_8c == *pbVar20) {
                (parser->mark).index = (parser->mark).index + 1;
                psVar1 = &(parser->mark).column;
                *psVar1 = *psVar1 + 1;
                parser->unread = parser->unread - 1;
                bVar12 = *pbVar20;
                lVar13 = 1;
                if ((((char)bVar12 < '\0') && (lVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
                   (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)) {
                  lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                }
                (parser->buffer).pointer = pbVar20 + lVar13;
                local_88.type = YAML_SCALAR_TOKEN;
                local_88._4_4_ = 0;
                local_88.start_mark.index = CONCAT44(uStack_a4,local_a8);
                local_88.start_mark.line = CONCAT44(uStack_9c,uStack_a0);
                local_88.start_mark.column = local_98;
                local_88.end_mark.index = local_c0->index;
                local_88.end_mark.line = local_c0->line;
                local_88.end_mark.column = local_c0->column;
                local_88.data.tag.handle = local_138;
                local_88.data.tag.suffix = local_128[0] + -(long)local_138;
                local_88.data._20_4_ = 0;
                local_88.data.scalar.style = (single == 0) + 2;
                yaml_free(local_f8);
                local_e8[0] = (byte *)0x0;
                local_f8 = (byte *)0x0;
                pbStack_f0 = (byte *)0x0;
                yaml_free(local_118);
                local_108[0] = (yaml_char_t *)0x0;
                local_118 = (byte *)0x0;
                pbStack_110 = (byte *)0x0;
                yaml_free(local_d8);
                tail = &(parser->tokens).tail;
                if (((parser->tokens).tail == (parser->tokens).end) &&
                   (iVar9 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                              &(parser->tokens).end), iVar9 == 0)) {
                  parser->error = YAML_MEMORY_ERROR;
                  yaml_token_delete(&local_88);
                  return 0;
                }
                pyVar21 = *tail;
                *tail = pyVar21 + 1;
                pyVar19 = &local_88;
                for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
                  uVar4 = *(undefined4 *)&pyVar19->field_0x4;
                  pyVar21->type = pyVar19->type;
                  *(undefined4 *)&pyVar21->field_0x4 = uVar4;
                  pyVar19 = (yaml_token_t *)((long)pyVar19 + ((ulong)bVar26 * -2 + 1) * 8);
                  pyVar21 = (yaml_token_t *)((long)pyVar21 + (ulong)bVar26 * -0x10 + 8);
                }
                return 1;
              }
LAB_0010d718:
              if ((parser->unread == 0) && (iVar9 = yaml_parser_update_buffer(parser,1), iVar9 == 0)
                 ) goto LAB_0010de24;
              pbVar20 = (parser->buffer).pointer;
              bVar12 = *pbVar20;
              if (0x1f < bVar12) {
                if (bVar12 != 0x20) {
                  if (bVar12 == 0xe2) {
                    if ((pbVar20[1] != 0x80) || (pbVar20[2] != 0xa8)) goto LAB_0010dc7f;
                  }
                  else if ((bVar12 != 0xc2) || (pbVar20[1] != 0x85)) goto LAB_0010dc7f;
                  if ((bVar12 != 0x20) && (bVar12 != 9)) goto LAB_0010d82f;
                }
LAB_0010d7bb:
                if (cVar25 == '\0') {
                  if ((pbStack_d0 <= local_c8 + 5) &&
                     (iVar9 = yaml_string_extend(&local_d8,&local_c8,&pbStack_d0), iVar9 == 0))
                  break;
                  pbVar20 = (parser->buffer).pointer;
                  bVar12 = *pbVar20;
                  if ((char)bVar12 < '\0') {
                    if ((bVar12 & 0xe0) == 0xc0) {
LAB_0010d97d:
                      (parser->buffer).pointer = pbVar20 + 1;
                      *local_c8 = *pbVar20;
                      pbVar20 = (parser->buffer).pointer;
                      local_c8 = local_c8 + 1;
                      goto LAB_0010d9a1;
                    }
                    if ((bVar12 & 0xf0) == 0xe0) {
LAB_0010d959:
                      (parser->buffer).pointer = pbVar20 + 1;
                      *local_c8 = *pbVar20;
                      pbVar20 = (parser->buffer).pointer;
                      local_c8 = local_c8 + 1;
                      goto LAB_0010d97d;
                    }
                    if ((bVar12 & 0xf8) == 0xf0) {
                      (parser->buffer).pointer = pbVar20 + 1;
                      *local_c8 = *pbVar20;
                      pbVar20 = (parser->buffer).pointer;
                      local_c8 = local_c8 + 1;
                      goto LAB_0010d959;
                    }
                  }
                  else {
LAB_0010d9a1:
                    pbVar11 = local_c8;
                    (parser->buffer).pointer = pbVar20 + 1;
                    local_c8 = local_c8 + 1;
                    *pbVar11 = *pbVar20;
                  }
                  (parser->mark).index = (parser->mark).index + 1;
                  psVar1 = &(parser->mark).column;
                  *psVar1 = *psVar1 + 1;
                  parser->unread = parser->unread - 1;
                  cVar25 = '\0';
                }
                else {
                  (parser->mark).index = (parser->mark).index + 1;
                  psVar1 = &(parser->mark).column;
                  *psVar1 = *psVar1 + 1;
                  parser->unread = parser->unread - 1;
                  bVar12 = *pbVar20;
                  lVar13 = 1;
                  if ((((char)bVar12 < '\0') && (lVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
                     (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)) {
                    lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                  }
                  (parser->buffer).pointer = pbVar20 + lVar13;
                  cVar25 = '\x01';
                }
                goto LAB_0010d718;
              }
              if (bVar12 == 9) goto LAB_0010d7bb;
              if ((bVar12 == 10) || (bVar12 == 0xd)) {
LAB_0010d82f:
                if ((parser->unread < 2) &&
                   (iVar9 = yaml_parser_update_buffer(parser,2), iVar9 == 0)) goto LAB_0010de24;
                if (cVar25 == '\0') {
                  local_c8 = local_d8;
                  memset(local_d8,0,(long)pbStack_d0 - (long)local_d8);
                  if ((pbStack_f0 <= local_e8[0] + 5) &&
                     (iVar9 = yaml_string_extend(&local_f8,local_e8,&pbStack_f0), iVar9 == 0))
                  break;
                  pbVar20 = (parser->buffer).pointer;
                  bVar12 = *pbVar20;
                  cVar25 = '\x01';
                  pbVar11 = local_e8[0];
                  if (bVar12 < 0xc2) {
                    if (bVar12 != 10) {
                      if (bVar12 != 0xd) goto LAB_0010d718;
                      if (pbVar20[1] == 10) {
                        local_e8[0] = local_e8[0] + 1;
                        goto LAB_0010da66;
                      }
                    }
                    local_e8[0] = local_e8[0] + 1;
                    goto LAB_0010db94;
                  }
                  if ((bVar12 != 0xc2) || (pbVar20[1] != 0x85)) goto LAB_0010d718;
                  local_e8[0] = local_e8[0] + 1;
LAB_0010dbbf:
                  *pbVar11 = 10;
                  ppyVar2 = &(parser->buffer).pointer;
                  *ppyVar2 = *ppyVar2 + 2;
                }
                else {
                  if ((pbStack_110 <= local_108[0] + 5) &&
                     (iVar9 = yaml_string_extend(&local_118,local_108,&pbStack_110), iVar9 == 0))
                  break;
                  pbVar11 = local_108[0];
                  pbVar20 = (parser->buffer).pointer;
                  bVar12 = *pbVar20;
                  cVar25 = '\x01';
                  if (0xc1 < bVar12) {
                    if ((bVar12 == 0xc2) && (pbVar20[1] == 0x85)) {
                      local_108[0] = local_108[0] + 1;
                      goto LAB_0010dbbf;
                    }
                    goto LAB_0010d718;
                  }
                  if (bVar12 != 10) {
                    if (bVar12 != 0xd) goto LAB_0010d718;
                    if (pbVar20[1] == 10) {
                      local_108[0] = local_108[0] + 1;
LAB_0010da66:
                      cVar25 = '\x01';
                      *pbVar11 = 10;
                      ppyVar2 = &(parser->buffer).pointer;
                      *ppyVar2 = *ppyVar2 + 2;
                      (parser->mark).index = (parser->mark).index + 2;
                      (parser->mark).column = 0;
                      psVar1 = &(parser->mark).line;
                      *psVar1 = *psVar1 + 1;
                      parser->unread = parser->unread - 2;
                      goto LAB_0010d718;
                    }
                  }
                  local_108[0] = local_108[0] + 1;
LAB_0010db94:
                  *pbVar11 = 10;
                  ppyVar2 = &(parser->buffer).pointer;
                  *ppyVar2 = *ppyVar2 + 1;
                }
                cVar25 = '\x01';
                (parser->mark).index = (parser->mark).index + 1;
                (parser->mark).column = 0;
                psVar1 = &(parser->mark).line;
                *psVar1 = *psVar1 + 1;
                parser->unread = parser->unread - 1;
                goto LAB_0010d718;
              }
LAB_0010dc7f:
              if (cVar25 == '\0') {
                b_end = &pbStack_d0;
                iVar9 = yaml_string_join(&local_138,local_128,&pbStack_130,&local_d8,&local_c8,b_end
                                        );
                if (iVar9 == 0) break;
                local_c8 = local_d8;
                pbVar20 = local_d8;
              }
              else if (*local_f8 == 10) {
                if (*local_118 == 0) {
                  if ((pbStack_130 <= local_128[0] + 5) &&
                     (iVar9 = yaml_string_extend(&local_138,local_128,&pbStack_130), iVar9 == 0))
                  break;
                  *local_128[0] = 0x20;
                  local_128[0] = local_128[0] + 1;
                }
                else {
                  iVar9 = yaml_string_join(&local_138,local_128,&pbStack_130,&local_118,local_108,
                                           &pbStack_110);
                  if (iVar9 == 0) break;
                  local_108[0] = local_118;
                  memset(local_118,0,(long)pbStack_110 - (long)local_118);
                }
                local_e8[0] = local_f8;
                b_end = &pbStack_f0;
                pbVar20 = local_f8;
              }
              else {
                iVar9 = yaml_string_join(&local_138,local_128,&pbStack_130,&local_f8,local_e8,
                                         &pbStack_f0);
                if (iVar9 == 0) break;
                local_e8[0] = local_f8;
                b_end = &pbStack_110;
                iVar9 = yaml_string_join(&local_138,local_128,&pbStack_130,&local_118,local_108,
                                         b_end);
                if (iVar9 == 0) break;
                local_108[0] = local_118;
                local_e8[0] = local_f8;
                memset(local_f8,0,(long)pbStack_f0 - (long)local_f8);
                local_108[0] = local_118;
                pbVar20 = local_118;
              }
              memset(pbVar20,0,(long)*b_end - (long)pbVar20);
            } while( true );
          }
        }
      }
    }
    parser->error = YAML_MEMORY_ERROR;
LAB_0010de24:
    yaml_free(local_138);
    local_128[0] = (byte *)0x0;
    local_138 = (byte *)0x0;
    pbStack_130 = (byte *)0x0;
    yaml_free(local_f8);
    local_e8[0] = (byte *)0x0;
    local_f8 = (byte *)0x0;
    pbStack_f0 = (byte *)0x0;
    yaml_free(local_118);
    local_108[0] = (yaml_char_t *)0x0;
    local_118 = (byte *)0x0;
    pbStack_110 = (byte *)0x0;
    yaml_free(local_d8);
  }
  return 0;
LAB_0010cb09:
  *local_128[0] = 0x27;
  sVar17 = (parser->mark).index;
  (parser->mark).index = sVar17 + 1;
  sVar18 = (parser->mark).column;
  (parser->mark).column = sVar18 + 1;
  pbVar20 = (parser->buffer).pointer;
  sVar22 = parser->unread;
  parser->unread = sVar22 - 1;
  bVar12 = *pbVar20;
  lVar13 = 1;
  lVar23 = 1;
  if ((((char)bVar12 < '\0') && (lVar23 = 2, (bVar12 & 0xe0) != 0xc0)) &&
     (lVar23 = 3, (bVar12 & 0xf0) != 0xe0)) {
    lVar23 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar20 + lVar23;
  (parser->mark).index = sVar17 + 2;
  (parser->mark).column = sVar18 + 2;
  parser->unread = sVar22 - 2;
  bVar12 = pbVar20[lVar23];
  if ((((char)bVar12 < '\0') && (lVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
     (lVar13 = 3, (bVar12 & 0xf0) != 0xe0)) {
    lVar13 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar20 + lVar23 + lVar13;
  local_128[0] = local_128[0] + 1;
  goto LAB_0010ca25;
}

Assistant:

static int
yaml_parser_fetch_flow_scalar(yaml_parser_t *parser, int single)
{
    yaml_token_t token;

    /* A plain scalar could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a flow scalar. */

    parser->simple_key_allowed = 0;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_flow_scalar(parser, &token, single))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}